

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

ssize_t wallet::send(int __fd,void *__buf,size_t __n,int __flags)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCResult> __l_03;
  undefined4 in_register_0000003c;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffb7f8;
  allocator<RPCArg> *paVar2;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar3;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffb800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb808;
  undefined4 in_stack_ffffffffffffb810;
  VType in_stack_ffffffffffffb814;
  UniValue *in_stack_ffffffffffffb818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb830;
  UniValue *in_stack_ffffffffffffb838;
  UniValue *in_stack_ffffffffffffb840;
  undefined7 in_stack_ffffffffffffb848;
  undefined1 in_stack_ffffffffffffb84f;
  string *in_stack_ffffffffffffb850;
  undefined7 in_stack_ffffffffffffb858;
  undefined1 in_stack_ffffffffffffb85f;
  undefined4 in_stack_ffffffffffffb860;
  Type in_stack_ffffffffffffb864;
  string *in_stack_ffffffffffffb868;
  undefined4 in_stack_ffffffffffffb870;
  Type in_stack_ffffffffffffb874;
  undefined4 in_stack_ffffffffffffb878;
  Type in_stack_ffffffffffffb87c;
  RPCArg *in_stack_ffffffffffffb880;
  RPCArgOptions *in_stack_ffffffffffffb8a0;
  undefined1 *local_4718;
  undefined1 *local_4700;
  undefined1 *local_46e8;
  undefined1 *local_46d0;
  RPCExamples *in_stack_ffffffffffffb940;
  undefined1 *puVar4;
  RPCResults *in_stack_ffffffffffffb948;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCMethodImpl *fun;
  undefined1 local_4250 [34];
  undefined1 local_422e;
  undefined1 local_422d;
  undefined1 local_422c [2];
  allocator<char> local_422a [2];
  pointer local_4228;
  pointer pRStack_4220;
  undefined8 local_4218;
  allocator<char> local_420a;
  allocator<char> local_4209 [31];
  allocator<char> local_41ea;
  allocator<char> local_41e9 [31];
  allocator<char> local_41ca;
  allocator<char> local_41c9 [17];
  undefined8 local_41b8;
  allocator<char> local_41a2;
  allocator<char> local_41a1 [31];
  allocator<char> local_4182;
  allocator<char> local_4181 [32];
  allocator<char> local_4161;
  vector<RPCArg,_std::allocator<RPCArg>_> local_4160;
  allocator<char> local_4144;
  allocator<char> local_4143 [2];
  allocator<char> local_4141;
  undefined4 local_4140;
  allocator<char> local_4139 [28];
  undefined1 local_411d [2];
  allocator<char> local_411b;
  allocator<char> local_411a;
  allocator<char> local_4119;
  allocator<char> local_4118 [2];
  allocator<char> local_4116;
  allocator<char> local_4115 [7];
  allocator<char> local_410e [2];
  allocator<char> local_410c;
  allocator<char> local_410b;
  allocator<char> local_410a;
  allocator<char> local_4109;
  undefined4 local_4108;
  allocator<char> local_4102;
  allocator<char> local_4101;
  undefined4 local_4100;
  allocator<char> local_40fa;
  allocator<char> local_40f9;
  undefined4 local_40f8;
  allocator<char> local_40f1 [25];
  allocator<char> local_40d8;
  allocator<char> local_40d7;
  allocator<char> local_40d6;
  allocator<char> local_40d5;
  allocator<char> local_40d4;
  allocator<char> local_40d3;
  allocator<char> local_40d2;
  allocator<char> local_40d1;
  allocator<char> local_40d0;
  allocator<char> local_40cf;
  allocator<char> local_40ce;
  allocator<char> local_40cd;
  allocator<char> local_40cc;
  allocator<char> local_40cb;
  allocator<char> local_40ca;
  allocator<char> local_40c9;
  allocator<char> local_40c8;
  undefined1 local_40c7;
  allocator<char> local_40c6;
  allocator<char> local_40c5;
  undefined4 local_40c4;
  allocator<char> local_40be;
  allocator<char> local_40bd;
  undefined4 local_40bc;
  allocator<char> local_40b7;
  allocator<char> local_40b6;
  undefined1 local_40b5;
  allocator<char> local_40b4;
  allocator<char> local_40b3;
  allocator<char> local_40b2;
  allocator<char> local_40b1 [52];
  allocator<char> local_407d;
  undefined4 local_407c;
  allocator<char> local_4078;
  allocator<char> local_4077;
  allocator<char> local_4076;
  allocator<char> local_4075;
  allocator<char> local_4074;
  allocator<char> local_4073;
  allocator<char> local_4072;
  allocator<char> local_4071 [32];
  allocator<char> local_4051;
  undefined4 local_4050;
  allocator<char> local_4049 [31];
  allocator<char> local_402a;
  allocator<char> local_4029 [41];
  undefined8 local_4000;
  undefined1 local_3aa8 [544];
  undefined1 local_3888 [200];
  allocator<RPCArg> local_37c0 [40];
  undefined8 local_3798;
  undefined8 uStack_3790;
  undefined8 local_3788;
  undefined1 local_3780;
  undefined1 local_377f;
  undefined1 local_3778;
  undefined8 local_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined1 local_3738;
  undefined1 local_3737;
  allocator<RPCArg> local_3638 [40];
  undefined8 local_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined1 local_35f8;
  undefined1 local_35f7;
  undefined1 local_35f0;
  undefined8 local_35c8;
  undefined8 uStack_35c0;
  undefined8 local_35b8;
  undefined1 local_35b0;
  undefined1 local_35af;
  undefined1 local_3508 [264];
  undefined1 local_3400 [280];
  undefined1 local_32e8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 local_32b0;
  undefined1 local_32a8;
  undefined1 local_32a7;
  undefined1 local_31e0;
  undefined8 local_31b8;
  undefined8 uStack_31b0;
  undefined8 local_31a8;
  undefined1 local_31a0;
  undefined1 local_319f;
  undefined1 local_30a0;
  undefined8 local_3078;
  undefined8 uStack_3070;
  undefined8 local_3068;
  undefined1 local_3060;
  undefined1 local_305f;
  undefined8 local_3000;
  allocator<RPCArg> local_2f60 [40];
  undefined8 local_2f38;
  undefined8 uStack_2f30;
  undefined8 local_2f28;
  undefined1 local_2f20;
  undefined1 local_2f1f;
  undefined1 local_2f18;
  undefined8 local_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined1 local_2ed8;
  undefined1 local_2ed7;
  undefined1 local_2e10;
  undefined8 local_2de8;
  undefined8 uStack_2de0;
  undefined8 local_2dd8;
  undefined1 local_2dd0;
  undefined1 local_2dcf;
  undefined1 local_2d28;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 local_2cf0;
  undefined1 local_2ce8;
  undefined1 local_2ce7;
  undefined1 local_2c40;
  undefined8 local_2c18;
  undefined8 uStack_2c10;
  undefined8 local_2c08;
  undefined1 local_2c00;
  undefined1 local_2bff;
  undefined1 local_2b58 [1056];
  undefined1 local_2738 [280];
  undefined1 local_2620;
  undefined8 local_25f8;
  undefined8 uStack_25f0;
  undefined8 local_25e8;
  undefined1 local_25e0;
  undefined1 local_25df;
  undefined1 local_2518;
  undefined8 local_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined1 local_24d8;
  undefined1 local_24d7;
  undefined1 local_23f0;
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  undefined8 local_23b8;
  undefined1 local_23b0;
  undefined1 local_23af;
  undefined1 local_22e8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 local_22b0;
  undefined1 local_22a8;
  undefined1 local_22a7;
  undefined1 local_21e0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_21a8;
  undefined1 local_21a0;
  undefined1 local_219f;
  undefined1 local_20d8;
  undefined8 local_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined1 local_2098;
  undefined1 local_2097;
  undefined8 local_2000;
  undefined1 local_1f98;
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined1 local_1f58;
  undefined1 local_1f57;
  undefined1 local_1eb0;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined1 local_1e70;
  undefined1 local_1e6f;
  undefined1 local_1d70;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined1 local_1d30;
  undefined1 local_1d2f;
  undefined1 local_1c30;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined1 local_1bf0;
  undefined1 local_1bef;
  undefined1 local_1b28 [2856];
  undefined8 local_1000;
  undefined1 local_aa8 [160];
  undefined1 local_a08;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined1 local_9c8;
  undefined1 local_9c7;
  undefined1 local_8e0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined1 local_8a0;
  undefined1 local_89f;
  undefined1 local_760;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined1 local_720;
  undefined1 local_71f;
  allocator<RPCArg> local_658 [40];
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined1 local_618;
  undefined1 local_617;
  undefined1 local_570 [1320];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_2000 = 0;
  local_3000 = 0;
  local_4000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_4050 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,&in_stack_ffffffffffffb800->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  OutputsDoc();
  local_658[0] = (allocator<RPCArg>)0x1;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_630 = 0;
  uStack_628 = 0;
  local_620 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffb7f8);
  local_618 = 0;
  local_617 = 0;
  paVar2 = local_658;
  RPCArg::RPCArg(in_stack_ffffffffffffb880,
                 (string *)CONCAT44(in_stack_ffffffffffffb87c,in_stack_ffffffffffffb878),
                 in_stack_ffffffffffffb874,(Fallback *)in_stack_ffffffffffffb868,
                 (string *)CONCAT44(in_stack_ffffffffffffb864,in_stack_ffffffffffffb860),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb8a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_760 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_738 = 0;
  uStack_730 = 0;
  local_728 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_720 = 0;
  local_71f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  UniValue::UniValue<const_char_(&)[6],_char[6],_true>
            (in_stack_ffffffffffffb840,(char (*) [6])in_stack_ffffffffffffb838);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  common::FeeModesDetail((string *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 in_stack_ffffffffffffb808);
  local_8e0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_8b8 = 0;
  uStack_8b0 = 0;
  local_8a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_8a0 = 0;
  local_89f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffb800);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffb840);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  local_a08 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_9e0 = 0;
  uStack_9d8 = 0;
  local_9d0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_9c8 = 0;
  local_9c7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_407c = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,&in_stack_ffffffffffffb800->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_1c30 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_1c08 = 0;
  uStack_1c00 = 0;
  local_1bf8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1bf0 = 0;
  local_1bef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_40b5 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffb838,(bool *)in_stack_ffffffffffffb830);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_1d70 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_1d48 = 0;
  uStack_1d40 = 0;
  local_1d38 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1d30 = 0;
  local_1d2f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_40bc = 0;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffb838,(int *)in_stack_ffffffffffffb830);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_1eb0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_1e88 = 0;
  uStack_1e80 = 0;
  local_1e78 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1e70 = 0;
  local_1e6f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_40c4 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,&in_stack_ffffffffffffb800->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_1f98 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_1f70 = 0;
  uStack_1f68 = 0;
  local_1f60 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1f58 = 0;
  local_1f57 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_40c7 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffb838,(bool *)in_stack_ffffffffffffb830);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_20d8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_20b0 = 0;
  uStack_20a8 = 0;
  local_20a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2098 = 0;
  local_2097 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_21e0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_21b8 = 0;
  uStack_21b0 = 0;
  local_21a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_21a0 = 0;
  local_219f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_22e8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_22c0 = 0;
  uStack_22b8 = 0;
  local_22b0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_22a8 = 0;
  local_22a7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_23f0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_23c8 = 0;
  uStack_23c0 = 0;
  local_23b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_23b0 = 0;
  local_23af = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffb800);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffb840);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  local_2518 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_24f0 = 0;
  uStack_24e8 = 0;
  local_24e0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_24d8 = 0;
  local_24d7 = 1;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_2620 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_25f8 = 0;
  uStack_25f0 = 0;
  local_25e8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_25e0 = 0;
  local_25df = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  UniValue::UniValue(in_stack_ffffffffffffb818,in_stack_ffffffffffffb814,in_stack_ffffffffffffb808);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_40f8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,&in_stack_ffffffffffffb800->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_2c40 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_2c18 = 0;
  uStack_2c10 = 0;
  local_2c08 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2c00 = 0;
  local_2bff = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_4100 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,&in_stack_ffffffffffffb800->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_2d28 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_2d00 = 0;
  uStack_2cf8 = 0;
  local_2cf0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2ce8 = 0;
  local_2ce7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_4108 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,&in_stack_ffffffffffffb800->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_2e10 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_2de8 = 0;
  uStack_2de0 = 0;
  local_2dd8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2dd0 = 0;
  local_2dcf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_2f18 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_2ef0 = 0;
  uStack_2ee8 = 0;
  local_2ee0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2ed8 = 0;
  local_2ed7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<RPCArg>::allocator(paVar2);
  __l._M_len._0_7_ = in_stack_ffffffffffffb848;
  __l._M_array = (iterator)in_stack_ffffffffffffb840;
  __l._M_len._7_1_ = in_stack_ffffffffffffb84f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb838,__l,
             (allocator_type *)in_stack_ffffffffffffb830);
  local_2f60[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_2f38 = 0;
  uStack_2f30 = 0;
  local_2f28 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2f20 = 0;
  local_2f1f = 0;
  paVar2 = local_2f60;
  RPCArg::RPCArg(in_stack_ffffffffffffb880,
                 (string *)CONCAT44(in_stack_ffffffffffffb87c,in_stack_ffffffffffffb878),
                 in_stack_ffffffffffffb874,(Fallback *)in_stack_ffffffffffffb868,
                 (string *)CONCAT44(in_stack_ffffffffffffb864,in_stack_ffffffffffffb860),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb8a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_4115[1] = (allocator<char>)0x0;
  local_4115[2] = (allocator<char>)0x0;
  local_4115[3] = (allocator<char>)0x0;
  local_4115[4] = (allocator<char>)0x0;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffb838,(int *)in_stack_ffffffffffffb830);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_30a0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_3078 = 0;
  uStack_3070 = 0;
  local_3068 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_3060 = 0;
  local_305f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_4118[1] = (allocator<char>)0x0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffb838,(bool *)in_stack_ffffffffffffb830);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_31e0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_31b8 = 0;
  uStack_31b0 = 0;
  local_31a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_31a0 = 0;
  local_319f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_32e8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_32c0 = 0;
  uStack_32b8 = 0;
  local_32b0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_32a8 = 0;
  local_32a7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  UniValue::UniValue(in_stack_ffffffffffffb818,in_stack_ffffffffffffb814,in_stack_ffffffffffffb808);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,in_stack_ffffffffffffb800);
  fun = (RPCMethodImpl *)local_411d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_4140 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,&in_stack_ffffffffffffb800->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_35f0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_35c8 = 0;
  uStack_35c0 = 0;
  local_35b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_35b0 = 0;
  local_35af = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffb848;
  __l_00._M_array = (iterator)in_stack_ffffffffffffb840;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffb84f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb838,__l_00,
             (allocator_type *)in_stack_ffffffffffffb830);
  local_3638[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_3610 = 0;
  uStack_3608 = 0;
  local_3600 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_35f8 = 0;
  local_35f7 = 0;
  paVar2 = local_3638;
  RPCArg::RPCArg(in_stack_ffffffffffffb880,
                 (string *)CONCAT44(in_stack_ffffffffffffb87c,in_stack_ffffffffffffb878),
                 in_stack_ffffffffffffb874,(Fallback *)in_stack_ffffffffffffb868,
                 (string *)CONCAT44(in_stack_ffffffffffffb864,in_stack_ffffffffffffb860),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb8a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  UniValue::UniValue<const_int_&,_int,_true>
            (in_stack_ffffffffffffb838,(int *)in_stack_ffffffffffffb830);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffb808,in_stack_ffffffffffffb800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_3778 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810));
  local_3750 = 0;
  uStack_3748 = 0;
  local_3740 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_3738 = 0;
  local_3737 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 in_stack_ffffffffffffb868,in_stack_ffffffffffffb864,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb850,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffb848;
  __l_01._M_array = (iterator)in_stack_ffffffffffffb840;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffb84f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb838,__l_01,
             (allocator_type *)in_stack_ffffffffffffb830);
  FundTxDoc(&local_4160,true);
  Cat<std::vector<RPCArg,std::allocator<RPCArg>>>
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb830,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb828);
  local_37c0[0] = (allocator<RPCArg>)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_3798 = 0;
  uStack_3790 = 0;
  local_3788 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_3780 = 0;
  local_377f = 0;
  paVar2 = local_37c0;
  RPCArg::RPCArg(in_stack_ffffffffffffb880,
                 (string *)CONCAT44(in_stack_ffffffffffffb87c,in_stack_ffffffffffffb878),
                 in_stack_ffffffffffffb874,(Fallback *)in_stack_ffffffffffffb868,
                 (string *)CONCAT44(in_stack_ffffffffffffb864,in_stack_ffffffffffffb860),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
                 in_stack_ffffffffffffb8a0);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffb848;
  __l_02._M_array = (iterator)in_stack_ffffffffffffb840;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffb84f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb838,__l_02,
             (allocator_type *)in_stack_ffffffffffffb830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_41c9._1_8_ = 0;
  local_41c9._9_8_ = 0;
  local_41b8._0_1_ = '\0';
  local_41b8._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffb880,in_stack_ffffffffffffb87c,
             (string *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
             in_stack_ffffffffffffb868,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffb864,in_stack_ffffffffffffb860),
             (bool)in_stack_ffffffffffffb85f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_41e9._1_8_ = 0;
  local_41e9._9_8_ = 0;
  local_41e9[0x11] = (allocator<char>)0x0;
  local_41e9[0x12] = (allocator<char>)0x0;
  local_41e9[0x13] = (allocator<char>)0x0;
  local_41e9[0x14] = (allocator<char>)0x0;
  local_41e9[0x15] = (allocator<char>)0x0;
  local_41e9[0x16] = (allocator<char>)0x0;
  local_41e9[0x17] = (allocator<char>)0x0;
  local_41e9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffb87c,in_stack_ffffffffffffb878),
             in_stack_ffffffffffffb874,in_stack_ffffffffffffb868,
             SUB41(in_stack_ffffffffffffb864 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffb850,
             (bool)in_stack_ffffffffffffb84f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_4209[1] = (allocator<char>)0x0;
  local_4209[2] = (allocator<char>)0x0;
  local_4209[3] = (allocator<char>)0x0;
  local_4209[4] = (allocator<char>)0x0;
  local_4209[5] = (allocator<char>)0x0;
  local_4209[6] = (allocator<char>)0x0;
  local_4209[7] = (allocator<char>)0x0;
  local_4209[8] = (allocator<char>)0x0;
  local_4209._9_8_ = 0;
  local_4209._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffb87c,in_stack_ffffffffffffb878),
             in_stack_ffffffffffffb874,in_stack_ffffffffffffb868,
             SUB41(in_stack_ffffffffffffb864 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffb850,
             (bool)in_stack_ffffffffffffb84f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  local_4228 = (pointer)0x0;
  pRStack_4220 = (pointer)0x0;
  local_4218 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  this = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffb87c,in_stack_ffffffffffffb878),
             in_stack_ffffffffffffb874,in_stack_ffffffffffffb868,
             SUB41(in_stack_ffffffffffffb864 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffb85f,in_stack_ffffffffffffb858),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffb850,
             (bool)in_stack_ffffffffffffb84f);
  std::allocator<RPCResult>::allocator(this);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffb848;
  __l_03._M_array = (iterator)in_stack_ffffffffffffb840;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffb84f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffb838,__l_03,
             (allocator_type *)in_stack_ffffffffffffb830);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffb880,in_stack_ffffffffffffb87c,
             (string *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
             in_stack_ffffffffffffb868,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffb864,in_stack_ffffffffffffb860),
             (bool)in_stack_ffffffffffffb85f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffb87c,in_stack_ffffffffffffb878),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffb840);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  HelpExampleCli(in_stack_ffffffffffffb830,in_stack_ffffffffffffb828);
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 in_stack_ffffffffffffb808);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 in_stack_ffffffffffffb808);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffb840);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  HelpExampleCli(in_stack_ffffffffffffb830,in_stack_ffffffffffffb828);
  std::operator+(in_stack_ffffffffffffb830,in_stack_ffffffffffffb828);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 in_stack_ffffffffffffb808);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  this_01 = (RPCHelpMan *)local_422c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffb840);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  HelpExampleCli(in_stack_ffffffffffffb830,in_stack_ffffffffffffb828);
  std::operator+(in_stack_ffffffffffffb830,in_stack_ffffffffffffb828);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 in_stack_ffffffffffffb808);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  name = (string *)&local_422d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffb840);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  HelpExampleCli(in_stack_ffffffffffffb830,in_stack_ffffffffffffb828);
  std::operator+(in_stack_ffffffffffffb830,in_stack_ffffffffffffb828);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  description = (string *)&local_422e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
             (char *)in_stack_ffffffffffffb840,(allocator<char> *)in_stack_ffffffffffffb838);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffb84f,in_stack_ffffffffffffb848),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffb840);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffb814,in_stack_ffffffffffffb810),
                 (char *)in_stack_ffffffffffffb808);
  HelpExampleCli(in_stack_ffffffffffffb830,in_stack_ffffffffffffb828);
  std::operator+(in_stack_ffffffffffffb830,in_stack_ffffffffffffb828);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x1834d23);
  this_00 = (RPCArg *)local_4250;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::send()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffb808,(anon_class_1_0_00000001 *)in_stack_ffffffffffffb800);
  RPCHelpMan::RPCHelpMan
            (this_01,name,description,(vector<RPCArg,_std::allocator<RPCArg>_> *)this_00,
             in_stack_ffffffffffffb948,in_stack_ffffffffffffb940,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_422e);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_422d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_422c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_422c + 1));
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_422a);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffb808);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar4 = local_3aa8;
  puVar1 = local_3888;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (puVar1 != puVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffb808);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_420a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_4209);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffb808);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_41ea);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_41e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffb808);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_41ca);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_41c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffb808);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_41a2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_41a1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4182);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_4181);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb808);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_46d0 = local_48;
  do {
    local_46d0 = local_46d0 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_46d0 != local_570);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::allocator<char>::~allocator(&local_4161);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb808);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb808);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb808);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_46e8 = local_aa8;
  do {
    local_46e8 = local_46e8 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_46e8 != local_1b28);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4144);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_4143);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb808);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_4700 = local_3400;
  do {
    local_4700 = local_4700 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_4700 != local_3508);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4141);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_4139);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_411d);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_411d + 1));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_411b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_411a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4119);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_4118);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4116);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_4115);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_410e);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb808);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_4718 = local_2738;
  do {
    local_4718 = local_4718 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_4718 != local_2b58);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_410c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_410b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_410a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4109);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4102);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4101);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40fa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40f9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_40f1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40d8);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40d7);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40d6);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40d5);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40d4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40d3);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40d2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40d1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40d0);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40cf);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40ce);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40cd);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40cc);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40cb);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40ca);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40c9);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40c8);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40c6);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40c5);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40be);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40bd);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40b7);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40b6);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40b4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40b3);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_40b2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_40b1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_407d);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4078);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4077);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4076);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4075);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4074);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4073);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4072);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_4071);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffb808);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_4051);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_4049);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_402a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_4029);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return CONCAT44(in_register_0000003c,__fd);
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan send()
{
    return RPCHelpMan{"send",
        "\nEXPERIMENTAL warning: this call may be changed in future releases.\n"
        "\nSend a transaction.\n",
        {
            {"outputs", RPCArg::Type::ARR, RPCArg::Optional::NO, "The outputs specified as key-value pairs.\n"
                    "Each key may only appear once, i.e. there can only be one 'data' output, and no address may be duplicated.\n"
                    "At least one output of either type must be specified.\n"
                    "For convenience, a dictionary, which holds the key-value pairs directly, is also accepted.",
                OutputsDoc(),
                RPCArgOptions{.skip_type_check = true}},
            {"conf_target", RPCArg::Type::NUM, RPCArg::DefaultHint{"wallet -txconfirmtarget"}, "Confirmation target in blocks"},
            {"estimate_mode", RPCArg::Type::STR, RPCArg::Default{"unset"}, "The fee estimate mode, must be one of (case insensitive):\n"
              + FeeModesDetail(std::string("economical mode is used if the transaction is replaceable;\notherwise, conservative mode is used"))},
            {"fee_rate", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"not set, fall back to wallet fee estimation"}, "Specify a fee rate in " + CURRENCY_ATOM + "/vB."},
            {"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "",
                Cat<std::vector<RPCArg>>(
                {
                    {"add_inputs", RPCArg::Type::BOOL, RPCArg::DefaultHint{"false when \"inputs\" are specified, true otherwise"},"Automatically include coins from the wallet to cover the target amount.\n"},
                    {"include_unsafe", RPCArg::Type::BOOL, RPCArg::Default{false}, "Include inputs that are not safe to spend (unconfirmed transactions from outside keys and unconfirmed replacement transactions).\n"
                                                          "Warning: the resulting transaction may become invalid if one of the unsafe inputs disappears.\n"
                                                          "If that happens, you will need to fund the transaction with different inputs and republish it."},
                    {"minconf", RPCArg::Type::NUM, RPCArg::Default{0}, "If add_inputs is specified, require inputs with at least this many confirmations."},
                    {"maxconf", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "If add_inputs is specified, require inputs with at most this many confirmations."},
                    {"add_to_wallet", RPCArg::Type::BOOL, RPCArg::Default{true}, "When false, returns a serialized transaction which will not be added to the wallet or broadcast"},
                    {"change_address", RPCArg::Type::STR, RPCArg::DefaultHint{"automatic"}, "The bitcoin address to receive the change"},
                    {"change_position", RPCArg::Type::NUM, RPCArg::DefaultHint{"random"}, "The index of the change output"},
                    {"change_type", RPCArg::Type::STR, RPCArg::DefaultHint{"set by -changetype"}, "The output type to use. Only valid if change_address is not specified. Options are \"legacy\", \"p2sh-segwit\", \"bech32\" and \"bech32m\"."},
                    {"fee_rate", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"not set, fall back to wallet fee estimation"}, "Specify a fee rate in " + CURRENCY_ATOM + "/vB.", RPCArgOptions{.also_positional = true}},
                    {"include_watching", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Also select inputs which are watch only.\n"
                                          "Only solvable inputs can be used. Watch-only destinations are solvable if the public key and/or output script was imported,\n"
                                          "e.g. with 'importpubkey' or 'importmulti' with the 'pubkeys' or 'desc' field."},
                    {"inputs", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "Specify inputs instead of adding them automatically. A JSON array of JSON objects",
                        {
                            {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                            {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output number"},
                            {"sequence", RPCArg::Type::NUM, RPCArg::Optional::NO, "The sequence number"},
                            {"weight", RPCArg::Type::NUM, RPCArg::DefaultHint{"Calculated from wallet and solving data"}, "The maximum weight for this input, "
                                        "including the weight of the outpoint and sequence number. "
                                        "Note that signature sizes are not guaranteed to be consistent, "
                                        "so the maximum DER signatures size of 73 bytes should be used when considering ECDSA signatures."
                                        "Remember to convert serialized sizes to weight units when necessary."},
                        },
                    },
                    {"locktime", RPCArg::Type::NUM, RPCArg::Default{0}, "Raw locktime. Non-0 value also locktime-activates inputs"},
                    {"lock_unspents", RPCArg::Type::BOOL, RPCArg::Default{false}, "Lock selected unspent outputs"},
                    {"psbt", RPCArg::Type::BOOL,  RPCArg::DefaultHint{"automatic"}, "Always return a PSBT, implies add_to_wallet=false."},
                    {"subtract_fee_from_outputs", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "Outputs to subtract the fee from, specified as integer indices.\n"
                    "The fee will be equally deducted from the amount of each specified output.\n"
                    "Those recipients will receive less bitcoins than you enter in their corresponding amount field.\n"
                    "If no outputs are specified here, the sender pays the fee.",
                        {
                            {"vout_index", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "The zero-based output index, before a change output is added."},
                        },
                    },
                    {"max_tx_weight", RPCArg::Type::NUM, RPCArg::Default{MAX_STANDARD_TX_WEIGHT}, "The maximum acceptable transaction weight.\n"
                                                  "Transaction building will fail if this can not be satisfied."},
                },
                FundTxDoc()),
                RPCArgOptions{.oneline_description="options"}},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::BOOL, "complete", "If the transaction has a complete set of signatures"},
                    {RPCResult::Type::STR_HEX, "txid", /*optional=*/true, "The transaction id for the send. Only 1 transaction is created regardless of the number of addresses."},
                    {RPCResult::Type::STR_HEX, "hex", /*optional=*/true, "If add_to_wallet is false, the hex-encoded raw transaction with signature(s)"},
                    {RPCResult::Type::STR, "psbt", /*optional=*/true, "If more signatures are needed, or if add_to_wallet is false, the base64-encoded (partially) signed transaction"}
                }
        },
        RPCExamples{""
        "\nSend 0.1 BTC with a confirmation target of 6 blocks in economical fee estimate mode\n"
        + HelpExampleCli("send", "'{\"" + EXAMPLE_ADDRESS[0] + "\": 0.1}' 6 economical\n") +
        "Send 0.2 BTC with a fee rate of 1.1 " + CURRENCY_ATOM + "/vB using positional arguments\n"
        + HelpExampleCli("send", "'{\"" + EXAMPLE_ADDRESS[0] + "\": 0.2}' null \"unset\" 1.1\n") +
        "Send 0.2 BTC with a fee rate of 1 " + CURRENCY_ATOM + "/vB using the options argument\n"
        + HelpExampleCli("send", "'{\"" + EXAMPLE_ADDRESS[0] + "\": 0.2}' null \"unset\" null '{\"fee_rate\": 1}'\n") +
        "Send 0.3 BTC with a fee rate of 25 " + CURRENCY_ATOM + "/vB using named arguments\n"
        + HelpExampleCli("-named send", "outputs='{\"" + EXAMPLE_ADDRESS[0] + "\": 0.3}' fee_rate=25\n") +
        "Create a transaction that should confirm the next block, with a specific input, and return result without adding to wallet or broadcasting to the network\n"
        + HelpExampleCli("send", "'{\"" + EXAMPLE_ADDRESS[0] + "\": 0.1}' 1 economical '{\"add_to_wallet\": false, \"inputs\": [{\"txid\":\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\", \"vout\":1}]}'")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
            if (!pwallet) return UniValue::VNULL;

            UniValue options{request.params[4].isNull() ? UniValue::VOBJ : request.params[4]};
            InterpretFeeEstimationInstructions(/*conf_target=*/request.params[1], /*estimate_mode=*/request.params[2], /*fee_rate=*/request.params[3], options);
            PreventOutdatedOptions(options);


            bool rbf{options.exists("replaceable") ? options["replaceable"].get_bool() : pwallet->m_signal_rbf};
            UniValue outputs(UniValue::VOBJ);
            outputs = NormalizeOutputs(request.params[0]);
            std::vector<CRecipient> recipients = CreateRecipients(
                    ParseOutputs(outputs),
                    InterpretSubtractFeeFromOutputInstructions(options["subtract_fee_from_outputs"], outputs.getKeys())
            );
            CMutableTransaction rawTx = ConstructTransaction(options["inputs"], request.params[0], options["locktime"], rbf);
            CCoinControl coin_control;
            // Automatically select coins, unless at least one is manually selected. Can
            // be overridden by options.add_inputs.
            coin_control.m_allow_other_inputs = rawTx.vin.size() == 0;
            if (options.exists("max_tx_weight")) {
                coin_control.m_max_tx_weight = options["max_tx_weight"].getInt<int>();
            }
            SetOptionsInputWeights(options["inputs"], options);
            // Clear tx.vout since it is not meant to be used now that we are passing outputs directly.
            // This sets us up for a future PR to completely remove tx from the function signature in favor of passing inputs directly
            rawTx.vout.clear();
            auto txr = FundTransaction(*pwallet, rawTx, recipients, options, coin_control, /*override_min_fee=*/false);

            return FinishTransaction(pwallet, options, CMutableTransaction(*txr.tx));
        }
    };
}